

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_slice_data(h264_slice *slice)

{
  uint local_14;
  int mb;
  h264_slice *slice_local;
  
  printf("Slice data:\n");
  local_14 = slice->first_mb_in_slice * (slice->mbaff_frame_flag + 1);
  while( true ) {
    if (slice->mbaff_frame_flag == 0) {
      printf("\tMacroblock %d (%d, %d):\n",(ulong)local_14,
             (ulong)(local_14 % slice->pic_width_in_mbs),
             (ulong)local_14 / (ulong)slice->pic_width_in_mbs);
    }
    else {
      printf("\tMacroblock %d (%d, %d, %d):\n",(ulong)local_14,
             ((long)(int)local_14 / 2 & 0xffffffffU) % (ulong)slice->pic_width_in_mbs,
             ((long)(int)local_14 / 2 & 0xffffffffU) / (ulong)slice->pic_width_in_mbs,
             (long)(int)local_14 % 2 & 0xffffffff);
    }
    h264_print_macroblock(slice,slice->mbs + (int)local_14);
    if (local_14 == slice->last_mb_in_slice) break;
    local_14 = h264_next_mb_addr(slice,local_14);
  }
  return;
}

Assistant:

void h264_print_slice_data(struct h264_slice *slice) {
	printf("Slice data:\n");
	int mb = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	while (1) {
		if (slice->mbaff_frame_flag)
			printf("\tMacroblock %d (%d, %d, %d):\n", mb, mb/2 % slice->pic_width_in_mbs, mb/2 / slice->pic_width_in_mbs, mb%2);
		else
			printf("\tMacroblock %d (%d, %d):\n", mb, mb % slice->pic_width_in_mbs, mb / slice->pic_width_in_mbs);
		h264_print_macroblock(slice, &slice->mbs[mb]);
		if (mb == slice->last_mb_in_slice)
			break;
		mb = h264_next_mb_addr(slice, mb);
	}
}